

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O0

void __thiscall
Js::JSONStringifier::ReadObjectElement
          (JSONStringifier *this,JavascriptString *propertyName,PropertyRecord *propertyRecord,
          RecyclableObject *obj,JSONObject *jsonObject,JSONObjectStack *objectStack)

{
  Var value_00;
  Var value;
  JSONObjectProperty prop;
  JSONObjectStack *objectStack_local;
  JSONObject *jsonObject_local;
  RecyclableObject *obj_local;
  PropertyRecord *propertyRecord_local;
  JavascriptString *propertyName_local;
  JSONStringifier *this_local;
  
  prop.propertyValue.field_1.numericValue.string.ptr = (Type)objectStack;
  JSONObjectProperty::JSONObjectProperty((JSONObjectProperty *)&value);
  Memory::WriteBarrierPtr<Js::JavascriptString>::operator=
            ((WriteBarrierPtr<Js::JavascriptString> *)&value,propertyName);
  value_00 = ReadValue(this,propertyName,propertyRecord,obj);
  ReadProperty(this,propertyName,obj,(JSONProperty *)&prop,value_00,
               (JSONObjectStack *)prop.propertyValue.field_1.numericValue.string.ptr);
  AppendObjectElement(this,propertyName,jsonObject,(JSONObjectProperty *)&value);
  return;
}

Assistant:

void
JSONStringifier::ReadObjectElement(
    _In_ JavascriptString* propertyName,
    _In_opt_ PropertyRecord const* propertyRecord,
    _In_ RecyclableObject* obj,
    _In_ JSONObject* jsonObject,
    _In_ JSONObjectStack* objectStack)
{
    JSONObjectProperty prop;
    prop.propertyName = propertyName;

    Var value = this->ReadValue(propertyName, propertyRecord, obj);

    this->ReadProperty(propertyName, obj, &prop.propertyValue, value, objectStack);

    this->AppendObjectElement(propertyName, jsonObject, &prop);
}